

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Codec.cpp
# Opt level: O0

string * __thiscall
higan::Codec::DecodeUrl_abi_cxx11_(string *__return_storage_ptr__,Codec *this,char *url,size_t len)

{
  char *pcVar1;
  char *pcVar2;
  allocator<char> local_55 [16];
  allocator<char> local_45;
  int local_44;
  char *pcStack_40;
  int num;
  char *buffer_ptr;
  char *url_end;
  char *url_ptr;
  char *buffer;
  size_t len_local;
  char *url_local;
  
  buffer = url;
  len_local = (size_t)this;
  url_local = (char *)__return_storage_ptr__;
  pcVar1 = (char *)operator_new__((ulong)(url + 1));
  memset(pcVar1,0,(size_t)(url + 1));
  url_end = (char *)len_local;
  buffer_ptr = buffer + len_local;
  pcStack_40 = pcVar1;
  url_ptr = pcVar1;
  do {
    if (buffer_ptr <= url_end) {
LAB_00115d0d:
      pcVar2 = url_ptr;
      pcVar1 = pcStack_40;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char*,void>
                ((string *)__return_storage_ptr__,pcVar2,pcVar1,local_55);
      std::allocator<char>::~allocator(local_55);
      return __return_storage_ptr__;
    }
    if (*url_end == '%') {
      pcVar1 = url_end + 1;
      if ((long)buffer_ptr - (long)pcVar1 < 2) {
        url_end = pcVar1;
        std::copy<char_const*,char*>(pcVar1,buffer_ptr,pcStack_40);
        goto LAB_00115d0d;
      }
      pcVar2 = url_end + 3;
      url_end = pcVar1;
      local_44 = HexCharArrayToInt(pcVar1,pcVar2);
      if (local_44 == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_45);
        std::allocator<char>::~allocator(&local_45);
        return __return_storage_ptr__;
      }
      *pcStack_40 = (char)local_44;
      url_end = url_end + 2;
    }
    else {
      *pcStack_40 = *url_end;
      url_end = url_end + 1;
    }
    pcStack_40 = pcStack_40 + 1;
  } while( true );
}

Assistant:

std::string Codec::DecodeUrl(const char* url, size_t len)
{
	char* buffer = new char[len + 1]{};

	const char* url_ptr = url;
	const char* url_end = url + len;

	char* buffer_ptr = buffer;

	while (url_ptr < url_end)
	{
		if (*url_ptr == '%')
		{
			url_ptr++;
			/**
			 * % 后面需要有两位字符 不足两位说明存在问题 拷贝剩余字符后break
			 */
			if (url_end - url_ptr >= 2)
			{
				int num = HexCharArrayToInt(url_ptr, url_ptr + 2);
				if (num == -1)
				{
					return "";
				}
				*buffer_ptr++ = static_cast<char>(num);
				url_ptr += 2;
			}
			else
			{
				std::copy(url_ptr, url_end, buffer_ptr);
				break;
			}
		}
		else
		{
			*buffer_ptr++ = *url_ptr++;
		}
	}

	return std::string(buffer, buffer_ptr);
}